

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

ssize_t Curl_recv_plain(connectdata *conn,int num,char *buf,size_t len,CURLcode *code)

{
  int err_00;
  Curl_easy *data;
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  int err;
  ssize_t nread;
  curl_socket_t sockfd;
  CURLcode *code_local;
  size_t len_local;
  char *buf_local;
  int num_local;
  connectdata *conn_local;
  
  sVar1 = recv(conn->sock[num],buf,len,0);
  *code = CURLE_OK;
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    err_00 = *piVar2;
    if (((err_00 == 0xb) || (err_00 == 0xb)) || (err_00 == 4)) {
      *code = CURLE_AGAIN;
    }
    else {
      data = conn->data;
      pcVar3 = Curl_strerror(conn,err_00);
      Curl_failf(data,"Recv failure: %s",pcVar3);
      (conn->data->state).os_errno = err_00;
      *code = CURLE_RECV_ERROR;
    }
  }
  return sVar1;
}

Assistant:

ssize_t Curl_recv_plain(struct connectdata *conn, int num, char *buf,
                        size_t len, CURLcode *code)
{
  curl_socket_t sockfd = conn->sock[num];
  ssize_t nread;
  /* Check and return data that already received and storied in internal
     intermediate buffer */
  nread = get_pre_recved(conn, num, buf, len);
  if(nread > 0) {
    *code = CURLE_OK;
    return nread;
  }

  nread = sread(sockfd, buf, len);

  *code = CURLE_OK;
  if(-1 == nread) {
    int err = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == err)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == err) || (EAGAIN == err) || (EINTR == err)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      *code = CURLE_AGAIN;
    }
    else {
      failf(conn->data, "Recv failure: %s",
            Curl_strerror(conn, err));
      conn->data->state.os_errno = err;
      *code = CURLE_RECV_ERROR;
    }
  }
  return nread;
}